

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O3

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context sStack_f8;
  
  __off = ftell((FILE *)f);
  stbi__start_file(&sStack_f8,f);
  iVar1 = stbi__hdr_test(&sStack_f8);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   long pos = ftell(f);
   int res;
   stbi__context s;
   stbi__start_file(&s,f);
   res = stbi__hdr_test(&s);
   fseek(f, pos, SEEK_SET);
   return res;
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}